

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_text_c4(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uchar *resized_font_bitmap;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uchar *puVar15;
  uchar *puVar16;
  
  iVar4 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar4 * fontpixelsize));
  sVar6 = strlen(text);
  uVar10 = 0;
  uVar8 = x;
  uVar9 = sVar6 & 0xffffffff;
  if ((int)sVar6 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    cVar1 = text[uVar10];
    if (cVar1 == ' ') {
      uVar7 = uVar8 + fontpixelsize;
    }
    else if (cVar1 == '\n') {
      y = y + iVar4;
      uVar7 = x;
    }
    else {
      iVar5 = isprint((int)cVar1);
      uVar7 = uVar8;
      if (iVar5 != 0) {
        resize_bilinear_font
                  ((uchar *)((long)cVar1 * 400 + 0x5394a0),resized_font_bitmap,fontpixelsize);
        uVar12 = 0;
        if (0 < y) {
          uVar12 = (ulong)(uint)y;
        }
        iVar5 = iVar4 + y;
        if (h <= iVar4 + y) {
          iVar5 = h;
        }
        uVar13 = 0;
        if (0 < (int)uVar8) {
          uVar13 = (ulong)uVar8;
        }
        uVar7 = uVar8 + fontpixelsize;
        uVar3 = w;
        if ((int)uVar7 < w) {
          uVar3 = uVar7;
        }
        puVar16 = pixels + (long)stride * uVar12 + (ulong)(uint)((int)uVar13 << 2);
        puVar15 = resized_font_bitmap +
                  (((uVar12 - (long)y) * (long)fontpixelsize + uVar13) - (long)(int)uVar8);
        for (; (long)uVar12 < (long)iVar5; uVar12 = uVar12 + 1) {
          for (lVar11 = 0; (int)uVar13 + (int)lVar11 < (int)uVar3; lVar11 = lVar11 + 1) {
            bVar2 = puVar15[lVar11];
            uVar14 = bVar2 ^ 0xff;
            puVar16[lVar11 * 4] =
                 (uchar)((ulong)((color & 0xff) * (uint)bVar2 + puVar16[lVar11 * 4] * uVar14) / 0xff
                        );
            uVar8 = (uint)bVar2;
            puVar16[lVar11 * 4 + 1] =
                 (uchar)((ulong)((color >> 8 & 0xff) * uVar8 + puVar16[lVar11 * 4 + 1] * uVar14) /
                        0xff);
            puVar16[lVar11 * 4 + 2] =
                 (uchar)((ulong)((color >> 0x10 & 0xff) * uVar8 + puVar16[lVar11 * 4 + 2] * uVar14)
                        / 0xff);
            puVar16[lVar11 * 4 + 3] =
                 (uchar)((ulong)(uVar8 * (color >> 0x18) + puVar16[lVar11 * 4 + 3] * uVar14) / 0xff)
            ;
          }
          puVar15 = puVar15 + fontpixelsize;
          puVar16 = puVar16 + stride;
        }
      }
    }
    uVar8 = uVar7;
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c4(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 4;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p[3] = (p[3] * (255 - alpha) + pen_color[3] * alpha) / 255;
                    p += 4;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}